

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  short sVar1;
  short sVar2;
  U16 UVar3;
  U16 UVar4;
  int iVar5;
  U32 UVar6;
  uint uVar7;
  U32 UVar8;
  U32 UVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  LZ4_stream_t *pLVar13;
  long lVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  reg_t rVar17;
  reg_t rVar18;
  char *pcVar19;
  ulong uVar20;
  uint in_ECX;
  int iVar21;
  char *pcVar22;
  char *in_RDX;
  char *pcVar23;
  undefined8 *in_RSI;
  void *pvVar24;
  int in_R8D;
  int in_R9D;
  bool bVar25;
  tableType_t tableType_1;
  tableType_t tableType;
  LZ4_stream_t_internal *ctx;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  U32 startIndex;
  BYTE *ip;
  int result;
  U32 h_6;
  U32 h_4;
  U32 h;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_1;
  U32 h_14;
  U32 h_12;
  U32 h_8;
  size_t accumulator_2;
  size_t lastRun_2;
  U32 matchIndex_5;
  U32 current_5;
  U32 h_23;
  U32 h_19;
  BYTE *ptr_2;
  U32 newMatchCode_2;
  uint more_2;
  BYTE *limit_2;
  uint matchCode_2;
  int len_2;
  uint litLength_2;
  U32 matchIndex_4;
  U32 current_4;
  U32 h_18;
  int searchMatchNb_5;
  int step_5;
  BYTE *forwardIp_5;
  U32 h_17;
  int searchMatchNb_4;
  int step_4;
  BYTE *forwardIp_4;
  BYTE *filledIp_2;
  BYTE *token_2;
  BYTE *match_2;
  U32 forwardH_2;
  U32 offset_2;
  BYTE *olimit_2;
  BYTE *op_2;
  BYTE *dictBase_2;
  BYTE *matchlimit_2;
  BYTE *mflimitPlusOne_2;
  BYTE *iend_2;
  BYTE *anchor_2;
  BYTE *dictEnd_2;
  U32 prefixIdxLimit_2;
  int maybe_extMem_2;
  U32 dictDelta_2;
  U32 dictSize_2;
  BYTE *dictionary_2;
  LZ4_stream_t_internal *dictCtx_2;
  BYTE *lowLimit_2;
  BYTE *base_2;
  U32 startIndex_2;
  BYTE *ip_2;
  int result_2;
  U32 h_22;
  U32 h_20;
  U32 h_16;
  size_t accumulator_3;
  size_t lastRun_3;
  U32 matchIndex_7;
  U32 current_7;
  U32 h_31;
  U32 h_27;
  BYTE *ptr_3;
  U32 newMatchCode_3;
  uint more_3;
  BYTE *limit_3;
  uint matchCode_3;
  int len_3;
  uint litLength_3;
  U32 matchIndex_6;
  U32 current_6;
  U32 h_26;
  int searchMatchNb_7;
  int step_7;
  BYTE *forwardIp_7;
  U32 h_25;
  int searchMatchNb_6;
  int step_6;
  BYTE *forwardIp_6;
  BYTE *filledIp_3;
  BYTE *token_3;
  BYTE *match_3;
  U32 forwardH_3;
  U32 offset_3;
  BYTE *olimit_3;
  BYTE *op_3;
  BYTE *dictBase_3;
  BYTE *matchlimit_3;
  BYTE *mflimitPlusOne_3;
  BYTE *iend_3;
  BYTE *anchor_3;
  BYTE *dictEnd_3;
  U32 prefixIdxLimit_3;
  int maybe_extMem_3;
  U32 dictDelta_3;
  U32 dictSize_3;
  BYTE *dictionary_3;
  LZ4_stream_t_internal *dictCtx_3;
  BYTE *lowLimit_3;
  BYTE *base_3;
  U32 startIndex_3;
  BYTE *ip_3;
  int result_3;
  U32 h_30;
  U32 h_28;
  U32 h_24;
  U16 *hashTable_86;
  U32 *hashTable_85;
  BYTE **hashTable_84;
  U16 *hashTable_101;
  U32 *hashTable_100;
  BYTE **hashTable_99;
  U16 *hashTable_98;
  U32 *hashTable_97;
  BYTE **hashTable_96;
  U16 *hashTable_83;
  U32 *hashTable_82;
  BYTE **hashTable_81;
  U16 *hashTable_59;
  U32 *hashTable_58;
  BYTE **hashTable_57;
  U16 *hashTable_74;
  U32 *hashTable_73;
  BYTE **hashTable_72;
  U16 *hashTable_71;
  U32 *hashTable_70;
  BYTE **hashTable_69;
  U16 *hashTable_56;
  U32 *hashTable_55;
  BYTE **hashTable_54;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U16 *hashTable_90;
  U32 *hashTable_89;
  U16 *hashTable_105;
  U32 *hashTable_104;
  U16 *hashTable_103;
  U32 *hashTable_102;
  U16 *hashTable_88;
  U32 *hashTable_87;
  U16 *hashTable_63;
  U32 *hashTable_62;
  U16 *hashTable_78;
  U32 *hashTable_77;
  U16 *hashTable_76;
  U32 *hashTable_75;
  U16 *hashTable_61;
  U32 *hashTable_60;
  U16 *hashTable_36;
  U32 *hashTable_35;
  U16 *hashTable_51;
  U32 *hashTable_50;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_24;
  U32 *hashTable_23;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_107;
  U32 *hashTable_106;
  U16 *hashTable_92;
  U32 *hashTable_91;
  U16 *hashTable_80;
  U32 *hashTable_79;
  U16 *hashTable_65;
  U32 *hashTable_64;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_38;
  U32 *hashTable_37;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U16 *hashTable_11;
  U32 *hashTable_10;
  BYTE *e_3;
  BYTE *s_3;
  BYTE *d_3;
  BYTE *e_2;
  BYTE *s_2;
  BYTE *d_2;
  BYTE *e_1;
  BYTE *s_1;
  BYTE *d_1;
  BYTE *e;
  BYTE *s;
  BYTE *d;
  reg_t diff_21;
  reg_t diff_20;
  BYTE *pStart_10;
  reg_t diff_19;
  reg_t diff_18;
  BYTE *pStart_9;
  reg_t diff_23;
  reg_t diff_22;
  BYTE *pStart_11;
  reg_t diff_15;
  reg_t diff_14;
  BYTE *pStart_7;
  reg_t diff_13;
  reg_t diff_12;
  BYTE *pStart_6;
  reg_t diff_17;
  reg_t diff_16;
  BYTE *pStart_8;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  U16 *hashTable_95;
  U32 *hashTable_94;
  BYTE **hashTable_93;
  U16 *hashTable_68;
  U32 *hashTable_67;
  BYTE **hashTable_66;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U32 h_29;
  U32 h_21;
  U32 h_13;
  U32 h_5;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes_26;
  U64 prime5bytes_26;
  U32 hashLog_26;
  U64 prime8bytes_36;
  U64 prime5bytes_36;
  U32 hashLog_36;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  U64 prime8bytes_20;
  U64 prime5bytes_20;
  U32 hashLog_20;
  U64 prime8bytes_21;
  U64 prime5bytes_21;
  U32 hashLog_21;
  U64 prime8bytes_23;
  U64 prime5bytes_23;
  U32 hashLog_23;
  U64 prime8bytes_25;
  U64 prime5bytes_25;
  U32 hashLog_25;
  U64 prime8bytes_28;
  U64 prime5bytes_28;
  U32 hashLog_28;
  U64 prime8bytes_29;
  U64 prime5bytes_29;
  U32 hashLog_29;
  U64 prime8bytes_27;
  U64 prime5bytes_27;
  U32 hashLog_27;
  U64 prime8bytes_24;
  U64 prime5bytes_24;
  U32 hashLog_24;
  U64 prime8bytes_22;
  U64 prime5bytes_22;
  U32 hashLog_22;
  U64 prime8bytes_30;
  U64 prime5bytes_30;
  U32 hashLog_30;
  U64 prime8bytes_31;
  U64 prime5bytes_31;
  U32 hashLog_31;
  U64 prime8bytes_33;
  U64 prime5bytes_33;
  U32 hashLog_33;
  U64 prime8bytes_35;
  U64 prime5bytes_35;
  U32 hashLog_35;
  U64 prime8bytes_38;
  U64 prime5bytes_38;
  U32 hashLog_38;
  U64 prime8bytes_39;
  U64 prime5bytes_39;
  U32 hashLog_39;
  U64 prime8bytes_37;
  U64 prime5bytes_37;
  U32 hashLog_37;
  U64 prime8bytes_34;
  U64 prime5bytes_34;
  U32 hashLog_34;
  U64 prime8bytes_32;
  U64 prime5bytes_32;
  U32 hashLog_32;
  undefined6 in_stack_ffffffffffffdc18;
  U16 in_stack_ffffffffffffdc1e;
  void *in_stack_ffffffffffffdc20;
  undefined4 in_stack_ffffffffffffdc28;
  undefined4 in_stack_ffffffffffffdc2c;
  int local_1fe4;
  int local_1fbc;
  int local_1f74;
  int local_1f2c;
  int local_1ee4;
  int local_1e9c;
  ulong local_1e98;
  uint local_1e60;
  int local_1e5c;
  int local_1e48;
  int local_1e44;
  undefined8 *local_1e40;
  char *local_1e18;
  undefined8 *local_1e10;
  uint local_1e08;
  char *local_1df8;
  undefined8 *local_1dd0;
  undefined8 *local_1d88;
  int local_1d38;
  ulong local_1cc0;
  uint local_1c88;
  int local_1c84;
  int local_1c70;
  int local_1c6c;
  undefined8 *local_1c68;
  char *local_1c40;
  undefined8 *local_1c38;
  uint local_1c30;
  char *local_1c20;
  undefined8 *local_1bf8;
  undefined8 *local_1bb0;
  ulong local_1ae8;
  uint local_1ab0;
  int local_1aac;
  int local_1a98;
  int local_1a94;
  undefined8 *local_1a90;
  char *local_1a68;
  undefined8 *local_1a60;
  uint local_1a58;
  char *local_1a48;
  undefined8 *local_1a20;
  undefined8 *local_19d8;
  int local_1988;
  ulong local_1910;
  uint local_18d8;
  int local_18d4;
  int local_18c0;
  int local_18bc;
  undefined8 *local_18b8;
  char *local_1890;
  undefined8 *local_1888;
  uint local_1880;
  char *local_1870;
  undefined8 *local_1848;
  undefined8 *local_1800;
  int local_17b0;
  undefined8 *local_d28;
  char *local_d20;
  undefined8 *local_cf8;
  char *local_cf0;
  undefined8 *local_cc8;
  char *local_cc0;
  undefined8 *local_c98;
  char *local_c90;
  char *local_be0;
  char *local_bd8;
  uint local_bcc;
  char *local_b38;
  char *local_b30;
  uint local_b24;
  char *local_a90;
  char *local_a88;
  uint local_a7c;
  char *local_9e8;
  char *local_9e0;
  uint local_9d4;
  uint local_604;
  uint local_5dc;
  uint local_5b4;
  uint local_58c;
  uint local_564;
  uint local_53c;
  uint local_334;
  uint local_30c;
  uint local_2e4;
  uint local_2bc;
  uint local_294;
  uint local_26c;
  
  pLVar13 = LZ4_initStream((void *)CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28),
                           (size_t)in_stack_ffffffffffffdc20);
  local_1fe4 = in_R9D;
  if (in_R9D < 1) {
    local_1fe4 = 1;
  }
  if (0x10001 < local_1fe4) {
    local_1fe4 = 0x10001;
  }
  iVar5 = LZ4_compressBound(in_ECX);
  sVar1 = (short)in_RSI;
  iVar21 = (int)in_RSI;
  local_1d38 = (int)in_RDX;
  if (in_R8D < iVar5) {
    if ((int)in_ECX < 0x1000b) {
      if (in_ECX < 0x7e000001) {
        if (in_ECX == 0) {
          if (in_R8D < 1) {
            local_1f2c = 0;
          }
          else {
            *in_RDX = '\0';
            local_1f2c = 1;
          }
        }
        else {
          lVar14 = (long)in_RSI - (ulong)(pLVar13->internal_donotuse).currentOffset;
          puVar15 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
          pcVar19 = in_RDX + in_R8D;
          if ((int)in_ECX < 0x1000b) {
            (pLVar13->internal_donotuse).dictSize = in_ECX + (pLVar13->internal_donotuse).dictSize;
            (pLVar13->internal_donotuse).currentOffset =
                 in_ECX + (pLVar13->internal_donotuse).currentOffset;
            (pLVar13->internal_donotuse).tableType = 3;
            local_1a48 = in_RDX;
            local_1a20 = in_RSI;
            if (0xc < (int)in_ECX) {
              UVar9 = LZ4_read32(in_RSI);
              uVar7 = UVar9 * -0x61c8864f >> 0x13;
              sVar2 = (short)lVar14;
              switch(0x1a59ae) {
              case 0:
                break;
              case 1:
                pLVar13->table[uVar7] = in_RSI;
                break;
              case 2:
                *(int *)((long)pLVar13 + (ulong)uVar7 * 4) = iVar21 - (int)lVar14;
                break;
              case 3:
                *(short *)((long)pLVar13 + (ulong)uVar7 * 2) = sVar1 - sVar2;
              }
              local_19d8 = (undefined8 *)((long)in_RSI + 1);
              UVar9 = LZ4_read32(local_19d8);
LAB_001a5b85:
              local_1a90 = local_19d8;
              local_1a94 = 1;
              local_1a98 = local_1fe4 << 6;
              puVar16 = local_1a90;
              do {
                local_1a90 = puVar16;
                local_1a58 = UVar9 * -0x61c8864f >> 0x13;
                puVar16 = (undefined8 *)((long)local_1a90 + (long)local_1a94);
                local_1a94 = local_1a98 >> 6;
                if (puVar15 < puVar16) goto LAB_001a87fe;
                local_1a60 = (undefined8 *)
                             (lVar14 + (ulong)*(ushort *)((long)pLVar13 + (ulong)local_1a58 * 2));
                UVar9 = LZ4_read32(puVar16);
                *(short *)((long)pLVar13 + (ulong)local_1a58 * 2) = (short)local_1a90 - sVar2;
                UVar8 = LZ4_read32(local_1a60);
                UVar6 = LZ4_read32(local_1a90);
                local_1a98 = local_1a98 + 1;
              } while (UVar8 != UVar6);
              local_19d8 = local_1a90;
              while( true ) {
                bVar25 = false;
                if (local_1a20 < local_19d8 && in_RSI < local_1a60) {
                  bVar25 = *(char *)((long)local_19d8 + -1) == *(char *)((long)local_1a60 + -1);
                }
                if (!bVar25) break;
                local_19d8 = (undefined8 *)((long)local_19d8 + -1);
                local_1a60 = (undefined8 *)((long)local_1a60 + -1);
              }
              uVar7 = (int)local_19d8 - (int)local_1a20;
              pcVar22 = local_1a48 + 1;
              local_1a68 = local_1a48;
              if (pcVar22 + (ulong)uVar7 / 0xff + (ulong)uVar7 + 8 <= pcVar19) {
                if (uVar7 < 0xf) {
                  *local_1a48 = (char)uVar7 * '\x10';
                  local_1a48 = pcVar22;
                }
                else {
                  *local_1a48 = -0x10;
                  local_1a48 = pcVar22;
                  for (local_1aac = uVar7 - 0xf; 0xfe < local_1aac; local_1aac = local_1aac + -0xff)
                  {
                    *local_1a48 = -1;
                    local_1a48 = local_1a48 + 1;
                  }
                  *local_1a48 = (char)local_1aac;
                  local_1a48 = local_1a48 + 1;
                }
                local_cf0 = local_1a48;
                local_cf8 = local_1a20;
                do {
                  *(undefined8 *)local_cf0 = *local_cf8;
                  local_cf0 = local_cf0 + 8;
                  local_cf8 = local_cf8 + 1;
                } while (local_cf0 < local_1a48 + uVar7);
                local_1a48 = local_1a48 + uVar7;
                do {
                  pcVar22 = local_1a48;
                  LZ4_writeLE16(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1e);
                  local_1a48 = local_1a48 + 2;
                  pcVar23 = (char *)((long)local_19d8 + 4);
                  local_b38 = (char *)((long)local_1a60 + 4);
                  local_b30 = pcVar23;
                  if (pcVar23 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
                    rVar17 = LZ4_read_ARCH(local_b38);
                    rVar18 = LZ4_read_ARCH(pcVar23);
                    if (rVar17 == rVar18) {
                      local_b38 = (char *)((long)local_1a60 + 0xc);
                      local_b30 = (char *)((long)local_19d8 + 0xc);
                      goto LAB_001a717a;
                    }
                    local_b24 = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                           in_stack_ffffffffffffdc18));
                  }
                  else {
LAB_001a717a:
                    for (; local_b30 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                        local_b30 = local_b30 + 8) {
                      rVar17 = LZ4_read_ARCH(local_b38);
                      rVar18 = LZ4_read_ARCH(local_b30);
                      if (rVar17 != rVar18) {
                        uVar7 = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                           in_stack_ffffffffffffdc18));
                        local_b24 = ((int)local_b30 + uVar7) - (int)pcVar23;
                        goto LAB_001a738f;
                      }
                      local_b38 = local_b38 + 8;
                    }
                    if (local_b30 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                      UVar9 = LZ4_read32(local_b38);
                      UVar8 = LZ4_read32(local_b30);
                      if (UVar9 == UVar8) {
                        local_b30 = local_b30 + 4;
                        local_b38 = local_b38 + 4;
                      }
                    }
                    if (local_b30 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                      UVar3 = LZ4_read16(local_b38);
                      UVar4 = LZ4_read16(local_b30);
                      if (UVar3 == UVar4) {
                        local_b30 = local_b30 + 2;
                        local_b38 = local_b38 + 2;
                      }
                    }
                    if ((local_b30 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                       (*local_b38 == *local_b30)) {
                      local_b30 = local_b30 + 1;
                    }
                    local_b24 = (int)local_b30 - (int)pcVar23;
                  }
LAB_001a738f:
                  local_1a20 = (undefined8 *)((ulong)local_b24 + 4 + (long)local_19d8);
                  if (pcVar19 < pcVar22 + (ulong)(local_b24 + 0xf0) / 0xff + 8) {
                    local_1988 = 0;
                    goto LAB_001a8a43;
                  }
                  if (local_b24 < 0xf) {
                    *local_1a68 = *local_1a68 + (char)local_b24;
                  }
                  else {
                    *local_1a68 = *local_1a68 + '\x0f';
                    local_1ab0 = local_b24 - 0xf;
                    LZ4_write32(local_1a48,0xffffffff);
                    for (; 0x3fb < local_1ab0; local_1ab0 = local_1ab0 - 0x3fc) {
                      local_1a48 = local_1a48 + 4;
                      LZ4_write32(local_1a48,0xffffffff);
                    }
                    pcVar22 = local_1a48 + (ulong)local_1ab0 / 0xff;
                    local_1a48 = pcVar22 + 1;
                    *pcVar22 = (char)((ulong)local_1ab0 % 0xff);
                  }
                  if (puVar15 <= local_1a20) goto LAB_001a87fe;
                  pvVar24 = (void *)((long)local_1a20 + -2);
                  UVar9 = LZ4_read32(pvVar24);
                  uVar7 = UVar9 * -0x61c8864f >> 0x13;
                  switch(0x1a7b1e) {
                  case 0:
                    break;
                  case 1:
                    pLVar13->table[uVar7] = pvVar24;
                    break;
                  case 2:
                    *(int *)((long)pLVar13 + (ulong)uVar7 * 4) = (int)pvVar24 - (int)lVar14;
                    break;
                  case 3:
                    *(short *)((long)pLVar13 + (ulong)uVar7 * 2) = (short)pvVar24 - sVar2;
                  }
                  UVar9 = LZ4_read32(local_1a20);
                  uVar7 = UVar9 * -0x61c8864f >> 0x13;
                  local_1a60 = (undefined8 *)
                               (lVar14 + (ulong)*(ushort *)((long)pLVar13 + (ulong)uVar7 * 2));
                  *(short *)((long)pLVar13 + (ulong)uVar7 * 2) = (short)local_1a20 - sVar2;
                  UVar9 = LZ4_read32(local_1a60);
                  UVar8 = LZ4_read32(local_1a20);
                  if (UVar9 != UVar8) goto LAB_001a8663;
                  local_1a68 = local_1a48;
                  *local_1a48 = '\0';
                  local_1a48 = local_1a48 + 1;
                  local_19d8 = local_1a20;
                } while( true );
              }
              local_1988 = 0;
              goto LAB_001a8a43;
            }
LAB_001a87fe:
            uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_1a20);
            if (pcVar19 < local_1a48 + (uVar20 + 0xf0) / 0xff + uVar20 + 1) {
              local_1988 = 0;
            }
            else {
              if (uVar20 < 0xf) {
                *local_1a48 = (char)uVar20 * '\x10';
                local_1a48 = local_1a48 + 1;
              }
              else {
                *local_1a48 = -0x10;
                pcVar19 = local_1a48;
                for (local_1ae8 = uVar20 - 0xf; local_1a48 = pcVar19 + 1, 0xfe < local_1ae8;
                    local_1ae8 = local_1ae8 - 0xff) {
                  *local_1a48 = -1;
                  pcVar19 = local_1a48;
                }
                *local_1a48 = (char)local_1ae8;
                local_1a48 = pcVar19 + 2;
              }
              memcpy(local_1a48,local_1a20,uVar20);
              local_1988 = ((int)uVar20 + (int)local_1a48) - local_1d38;
            }
          }
          else {
            local_1988 = 0;
          }
LAB_001a8a43:
          local_1f2c = local_1988;
        }
      }
      else {
        local_1f2c = 0;
      }
      local_1fbc = local_1f2c;
    }
    else {
      if (in_ECX < 0x7e000001) {
        if (in_ECX == 0) {
          if (in_R8D < 1) {
            local_1f74 = 0;
          }
          else {
            *in_RDX = '\0';
            local_1f74 = 1;
          }
        }
        else {
          lVar14 = (long)in_RSI - (ulong)(pLVar13->internal_donotuse).currentOffset;
          puVar15 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
          pcVar19 = in_RDX + in_R8D;
          (pLVar13->internal_donotuse).dictSize = in_ECX + (pLVar13->internal_donotuse).dictSize;
          (pLVar13->internal_donotuse).currentOffset =
               in_ECX + (pLVar13->internal_donotuse).currentOffset;
          (pLVar13->internal_donotuse).tableType = 2;
          local_1870 = in_RDX;
          local_1848 = in_RSI;
          if (0xc < (int)in_ECX) {
            rVar17 = LZ4_read_ARCH(in_RSI);
            uVar7 = LZ4_isLittleEndian();
            if (uVar7 == 0) {
              local_334 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_334 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_334 = local_334 >> 0x14;
            iVar5 = (int)lVar14;
            switch(0x1a92c6) {
            case 0:
              break;
            case 1:
              pLVar13->table[local_334] = in_RSI;
              break;
            case 2:
              *(int *)((long)pLVar13 + (ulong)local_334 * 4) = iVar21 - iVar5;
              break;
            case 3:
              *(short *)((long)pLVar13 + (ulong)local_334 * 2) = sVar1 - (short)lVar14;
            }
            local_1800 = (undefined8 *)((long)in_RSI + 1);
            rVar17 = LZ4_read_ARCH(local_1800);
            uVar7 = LZ4_isLittleEndian();
            if (uVar7 == 0) {
              local_30c = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_30c = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_30c = local_30c >> 0x14;
            local_1880 = local_30c;
LAB_001a94d6:
            local_18b8 = local_1800;
            local_18bc = 1;
            local_18c0 = local_1fe4 << 6;
            puVar16 = local_18b8;
            do {
              do {
                local_18b8 = puVar16;
                uVar12 = local_1880;
                uVar10 = (int)local_18b8 - iVar5;
                uVar7 = *(uint *)((long)pLVar13 + (ulong)local_1880 * 4);
                puVar16 = (undefined8 *)((long)local_18b8 + (long)local_18bc);
                iVar21 = local_18c0 + 1;
                local_18bc = local_18c0 >> 6;
                if (puVar15 < puVar16) goto LAB_001ac0e0;
                local_1888 = (undefined8 *)(lVar14 + (ulong)uVar7);
                rVar17 = LZ4_read_ARCH(puVar16);
                uVar11 = LZ4_isLittleEndian();
                if (uVar11 == 0) {
                  local_2e4 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_2e4 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
                }
                local_2e4 = local_2e4 >> 0x14;
                local_1880 = local_2e4;
                *(uint *)((long)pLVar13 + (ulong)uVar12 * 4) = uVar10;
                local_18c0 = iVar21;
              } while (uVar7 + 0xffff < uVar10);
              UVar9 = LZ4_read32(local_1888);
              UVar8 = LZ4_read32(local_18b8);
            } while (UVar9 != UVar8);
            local_1800 = local_18b8;
            while( true ) {
              bVar25 = false;
              if (local_1848 < local_1800 && in_RSI < local_1888) {
                bVar25 = *(char *)((long)local_1800 + -1) == *(char *)((long)local_1888 + -1);
              }
              if (!bVar25) break;
              local_1800 = (undefined8 *)((long)local_1800 + -1);
              local_1888 = (undefined8 *)((long)local_1888 + -1);
            }
            uVar7 = (int)local_1800 - (int)local_1848;
            pcVar22 = local_1870 + 1;
            local_1890 = local_1870;
            if (pcVar22 + (ulong)uVar7 / 0xff + (ulong)uVar7 + 8 <= pcVar19) {
              if (uVar7 < 0xf) {
                *local_1870 = (char)uVar7 * '\x10';
                local_1870 = pcVar22;
              }
              else {
                *local_1870 = -0x10;
                local_1870 = pcVar22;
                for (local_18d4 = uVar7 - 0xf; 0xfe < local_18d4; local_18d4 = local_18d4 + -0xff) {
                  *local_1870 = -1;
                  local_1870 = local_1870 + 1;
                }
                *local_1870 = (char)local_18d4;
                local_1870 = local_1870 + 1;
              }
              local_d20 = local_1870;
              local_d28 = local_1848;
              do {
                *(undefined8 *)local_d20 = *local_d28;
                local_d20 = local_d20 + 8;
                local_d28 = local_d28 + 1;
              } while (local_d20 < local_1870 + uVar7);
              local_1870 = local_1870 + uVar7;
              do {
                pcVar22 = local_1870;
                LZ4_writeLE16(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1e);
                local_1870 = local_1870 + 2;
                pcVar23 = (char *)((long)local_1800 + 4);
                local_be0 = (char *)((long)local_1888 + 4);
                local_bd8 = pcVar23;
                if (pcVar23 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
                  rVar17 = LZ4_read_ARCH(local_be0);
                  rVar18 = LZ4_read_ARCH(pcVar23);
                  if (rVar17 == rVar18) {
                    local_be0 = (char *)((long)local_1888 + 0xc);
                    local_bd8 = (char *)((long)local_1800 + 0xc);
                    goto LAB_001aaa9b;
                  }
                  local_bcc = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                         in_stack_ffffffffffffdc18));
                }
                else {
LAB_001aaa9b:
                  for (; local_bd8 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                      local_bd8 = local_bd8 + 8) {
                    rVar17 = LZ4_read_ARCH(local_be0);
                    rVar18 = LZ4_read_ARCH(local_bd8);
                    if (rVar17 != rVar18) {
                      uVar7 = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                         in_stack_ffffffffffffdc18));
                      local_bcc = ((int)local_bd8 + uVar7) - (int)pcVar23;
                      goto LAB_001aac9e;
                    }
                    local_be0 = local_be0 + 8;
                  }
                  if (local_bd8 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                    UVar9 = LZ4_read32(local_be0);
                    UVar8 = LZ4_read32(local_bd8);
                    if (UVar9 == UVar8) {
                      local_bd8 = local_bd8 + 4;
                      local_be0 = local_be0 + 4;
                    }
                  }
                  if (local_bd8 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                    UVar3 = LZ4_read16(local_be0);
                    UVar4 = LZ4_read16(local_bd8);
                    if (UVar3 == UVar4) {
                      local_bd8 = local_bd8 + 2;
                      local_be0 = local_be0 + 2;
                    }
                  }
                  if ((local_bd8 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                     (*local_be0 == *local_bd8)) {
                    local_bd8 = local_bd8 + 1;
                  }
                  local_bcc = (int)local_bd8 - (int)pcVar23;
                }
LAB_001aac9e:
                local_1848 = (undefined8 *)((ulong)local_bcc + 4 + (long)local_1800);
                if (pcVar19 < pcVar22 + (ulong)(local_bcc + 0xf0) / 0xff + 8) {
                  local_17b0 = 0;
                  goto LAB_001ac31f;
                }
                if (local_bcc < 0xf) {
                  *local_1890 = *local_1890 + (char)local_bcc;
                }
                else {
                  *local_1890 = *local_1890 + '\x0f';
                  local_18d8 = local_bcc - 0xf;
                  LZ4_write32(local_1870,0xffffffff);
                  for (; 0x3fb < local_18d8; local_18d8 = local_18d8 - 0x3fc) {
                    local_1870 = local_1870 + 4;
                    LZ4_write32(local_1870,0xffffffff);
                  }
                  pcVar22 = local_1870 + (ulong)local_18d8 / 0xff;
                  local_1870 = pcVar22 + 1;
                  *pcVar22 = (char)((ulong)local_18d8 % 0xff);
                }
                if (puVar15 <= local_1848) goto LAB_001ac0e0;
                pvVar24 = (void *)((long)local_1848 + -2);
                rVar17 = LZ4_read_ARCH(pvVar24);
                uVar7 = LZ4_isLittleEndian();
                if (uVar7 == 0) {
                  local_2bc = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_2bc = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
                }
                local_2bc = local_2bc >> 0x14;
                switch(0x1ab3e2) {
                case 0:
                  break;
                case 1:
                  pLVar13->table[local_2bc] = pvVar24;
                  break;
                case 2:
                  *(int *)((long)pLVar13 + (ulong)local_2bc * 4) = (int)pvVar24 - iVar5;
                  break;
                case 3:
                  *(short *)((long)pLVar13 + (ulong)local_2bc * 2) = (short)pvVar24 - (short)lVar14;
                }
                rVar17 = LZ4_read_ARCH(local_1848);
                uVar7 = LZ4_isLittleEndian();
                if (uVar7 == 0) {
                  local_294 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_294 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
                }
                local_294 = local_294 >> 0x14;
                uVar12 = (int)local_1848 - iVar5;
                uVar7 = *(uint *)((long)pLVar13 + (ulong)local_294 * 4);
                local_1888 = (undefined8 *)(lVar14 + (ulong)uVar7);
                *(uint *)((long)pLVar13 + (ulong)local_294 * 4) = uVar12;
                if (uVar7 + 0xffff < uVar12) goto LAB_001abf43;
                UVar9 = LZ4_read32(local_1888);
                UVar8 = LZ4_read32(local_1848);
                if (UVar9 != UVar8) goto LAB_001abf43;
                local_1890 = local_1870;
                *local_1870 = '\0';
                local_1870 = local_1870 + 1;
                local_1800 = local_1848;
              } while( true );
            }
            local_17b0 = 0;
            goto LAB_001ac31f;
          }
LAB_001ac0e0:
          uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_1848);
          if (pcVar19 < local_1870 + (uVar20 + 0xf0) / 0xff + uVar20 + 1) {
            local_17b0 = 0;
          }
          else {
            if (uVar20 < 0xf) {
              *local_1870 = (char)uVar20 * '\x10';
              local_1870 = local_1870 + 1;
            }
            else {
              *local_1870 = -0x10;
              pcVar19 = local_1870;
              for (local_1910 = uVar20 - 0xf; local_1870 = pcVar19 + 1, 0xfe < local_1910;
                  local_1910 = local_1910 - 0xff) {
                *local_1870 = -1;
                pcVar19 = local_1870;
              }
              *local_1870 = (char)local_1910;
              local_1870 = pcVar19 + 2;
            }
            memcpy(local_1870,local_1848,uVar20);
            local_17b0 = ((int)uVar20 + (int)local_1870) - local_1d38;
          }
LAB_001ac31f:
          local_1f74 = local_17b0;
        }
      }
      else {
        local_1f74 = 0;
      }
      local_1fbc = local_1f74;
    }
  }
  else if ((int)in_ECX < 0x1000b) {
    if (in_ECX < 0x7e000001) {
      if (in_ECX == 0) {
        *in_RDX = '\0';
        local_1e9c = 1;
      }
      else {
        lVar14 = (long)in_RSI - (ulong)(pLVar13->internal_donotuse).currentOffset;
        puVar15 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
        if ((int)in_ECX < 0x1000b) {
          (pLVar13->internal_donotuse).dictSize = in_ECX + (pLVar13->internal_donotuse).dictSize;
          (pLVar13->internal_donotuse).currentOffset =
               in_ECX + (pLVar13->internal_donotuse).currentOffset;
          (pLVar13->internal_donotuse).tableType = 3;
          local_1df8 = in_RDX;
          local_1dd0 = in_RSI;
          if (0xc < (int)in_ECX) {
            UVar9 = LZ4_read32(in_RSI);
            uVar7 = UVar9 * -0x61c8864f >> 0x13;
            sVar2 = (short)lVar14;
            switch(0x19e709) {
            case 0:
              break;
            case 1:
              pLVar13->table[uVar7] = in_RSI;
              break;
            case 2:
              *(int *)((long)pLVar13 + (ulong)uVar7 * 4) = iVar21 - (int)lVar14;
              break;
            case 3:
              *(short *)((long)pLVar13 + (ulong)uVar7 * 2) = sVar1 - sVar2;
            }
            local_1d88 = (undefined8 *)((long)in_RSI + 1);
            UVar9 = LZ4_read32(local_1d88);
LAB_0019e8e0:
            local_1e40 = local_1d88;
            local_1e44 = 1;
            local_1e48 = local_1fe4 << 6;
            puVar16 = local_1e40;
            do {
              local_1e40 = puVar16;
              local_1e08 = UVar9 * -0x61c8864f >> 0x13;
              puVar16 = (undefined8 *)((long)local_1e40 + (long)local_1e44);
              local_1e44 = local_1e48 >> 6;
              if (puVar15 < puVar16) goto LAB_001a1559;
              local_1e10 = (undefined8 *)
                           (lVar14 + (ulong)*(ushort *)((long)pLVar13 + (ulong)local_1e08 * 2));
              UVar9 = LZ4_read32(puVar16);
              *(short *)((long)pLVar13 + (ulong)local_1e08 * 2) = (short)local_1e40 - sVar2;
              UVar8 = LZ4_read32(local_1e10);
              UVar6 = LZ4_read32(local_1e40);
              local_1e48 = local_1e48 + 1;
            } while (UVar8 != UVar6);
            local_1d88 = local_1e40;
            while( true ) {
              bVar25 = false;
              if (local_1dd0 < local_1d88 && in_RSI < local_1e10) {
                bVar25 = *(char *)((long)local_1d88 + -1) == *(char *)((long)local_1e10 + -1);
              }
              if (!bVar25) break;
              local_1d88 = (undefined8 *)((long)local_1d88 + -1);
              local_1e10 = (undefined8 *)((long)local_1e10 + -1);
            }
            uVar7 = (int)local_1d88 - (int)local_1dd0;
            local_1e18 = local_1df8;
            if (uVar7 < 0xf) {
              *local_1df8 = (char)uVar7 * '\x10';
              local_1df8 = local_1df8 + 1;
            }
            else {
              *local_1df8 = -0x10;
              local_1df8 = local_1df8 + 1;
              for (local_1e5c = uVar7 - 0xf; 0xfe < local_1e5c; local_1e5c = local_1e5c + -0xff) {
                *local_1df8 = -1;
                local_1df8 = local_1df8 + 1;
              }
              *local_1df8 = (char)local_1e5c;
              local_1df8 = local_1df8 + 1;
            }
            local_c90 = local_1df8;
            local_c98 = local_1dd0;
            do {
              *(undefined8 *)local_c90 = *local_c98;
              local_c90 = local_c90 + 8;
              local_c98 = local_c98 + 1;
            } while (local_c90 < local_1df8 + uVar7);
            local_1df8 = local_1df8 + uVar7;
            do {
              LZ4_writeLE16(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1e);
              local_1df8 = local_1df8 + 2;
              pcVar19 = (char *)((long)local_1d88 + 4);
              local_9e8 = (char *)((long)local_1e10 + 4);
              local_9e0 = pcVar19;
              if (pcVar19 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
                rVar17 = LZ4_read_ARCH(local_9e8);
                rVar18 = LZ4_read_ARCH(pcVar19);
                if (rVar17 == rVar18) {
                  local_9e8 = (char *)((long)local_1e10 + 0xc);
                  local_9e0 = (char *)((long)local_1d88 + 0xc);
                  goto LAB_0019fed5;
                }
                local_9d4 = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                       in_stack_ffffffffffffdc18));
              }
              else {
LAB_0019fed5:
                for (; local_9e0 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                    local_9e0 = local_9e0 + 8) {
                  rVar17 = LZ4_read_ARCH(local_9e8);
                  rVar18 = LZ4_read_ARCH(local_9e0);
                  if (rVar17 != rVar18) {
                    uVar7 = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                       in_stack_ffffffffffffdc18));
                    local_9d4 = ((int)local_9e0 + uVar7) - (int)pcVar19;
                    goto LAB_001a00ea;
                  }
                  local_9e8 = local_9e8 + 8;
                }
                if (local_9e0 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                  UVar9 = LZ4_read32(local_9e8);
                  UVar8 = LZ4_read32(local_9e0);
                  if (UVar9 == UVar8) {
                    local_9e0 = local_9e0 + 4;
                    local_9e8 = local_9e8 + 4;
                  }
                }
                if (local_9e0 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                  UVar3 = LZ4_read16(local_9e8);
                  UVar4 = LZ4_read16(local_9e0);
                  if (UVar3 == UVar4) {
                    local_9e0 = local_9e0 + 2;
                    local_9e8 = local_9e8 + 2;
                  }
                }
                if ((local_9e0 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                   (*local_9e8 == *local_9e0)) {
                  local_9e0 = local_9e0 + 1;
                }
                local_9d4 = (int)local_9e0 - (int)pcVar19;
              }
LAB_001a00ea:
              local_1dd0 = (undefined8 *)((ulong)local_9d4 + 4 + (long)local_1d88);
              if (local_9d4 < 0xf) {
                *local_1e18 = *local_1e18 + (char)local_9d4;
              }
              else {
                *local_1e18 = *local_1e18 + '\x0f';
                local_1e60 = local_9d4 - 0xf;
                LZ4_write32(local_1df8,0xffffffff);
                for (; 0x3fb < local_1e60; local_1e60 = local_1e60 - 0x3fc) {
                  local_1df8 = local_1df8 + 4;
                  LZ4_write32(local_1df8,0xffffffff);
                }
                pcVar19 = local_1df8 + (ulong)local_1e60 / 0xff;
                local_1df8 = pcVar19 + 1;
                *pcVar19 = (char)((ulong)local_1e60 % 0xff);
              }
              if (puVar15 <= local_1dd0) break;
              pvVar24 = (void *)((long)local_1dd0 + -2);
              UVar9 = LZ4_read32(pvVar24);
              uVar7 = UVar9 * -0x61c8864f >> 0x13;
              switch(0x1a0879) {
              case 0:
                break;
              case 1:
                pLVar13->table[uVar7] = pvVar24;
                break;
              case 2:
                *(int *)((long)pLVar13 + (ulong)uVar7 * 4) = (int)pvVar24 - (int)lVar14;
                break;
              case 3:
                *(short *)((long)pLVar13 + (ulong)uVar7 * 2) = (short)pvVar24 - sVar2;
              }
              UVar9 = LZ4_read32(local_1dd0);
              uVar7 = UVar9 * -0x61c8864f >> 0x13;
              local_1e10 = (undefined8 *)
                           (lVar14 + (ulong)*(ushort *)((long)pLVar13 + (ulong)uVar7 * 2));
              *(short *)((long)pLVar13 + (ulong)uVar7 * 2) = (short)local_1dd0 - sVar2;
              UVar9 = LZ4_read32(local_1e10);
              UVar8 = LZ4_read32(local_1dd0);
              if (UVar9 != UVar8) goto LAB_001a13be;
              local_1e18 = local_1df8;
              *local_1df8 = '\0';
              local_1df8 = local_1df8 + 1;
              local_1d88 = local_1dd0;
            } while( true );
          }
LAB_001a1559:
          uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_1dd0);
          if (uVar20 < 0xf) {
            *local_1df8 = (char)uVar20 * '\x10';
            local_1df8 = local_1df8 + 1;
          }
          else {
            *local_1df8 = -0x10;
            pcVar19 = local_1df8;
            for (local_1e98 = uVar20 - 0xf; local_1df8 = pcVar19 + 1, 0xfe < local_1e98;
                local_1e98 = local_1e98 - 0xff) {
              *local_1df8 = -1;
              pcVar19 = local_1df8;
            }
            *local_1df8 = (char)local_1e98;
            local_1df8 = pcVar19 + 2;
          }
          memcpy(local_1df8,local_1dd0,uVar20);
          local_1d38 = ((int)uVar20 + (int)local_1df8) - local_1d38;
        }
        else {
          local_1d38 = 0;
        }
        local_1e9c = local_1d38;
      }
    }
    else {
      local_1e9c = 0;
    }
    local_1fbc = local_1e9c;
  }
  else {
    if (in_ECX < 0x7e000001) {
      if (in_ECX == 0) {
        *in_RDX = '\0';
        local_1ee4 = 1;
      }
      else {
        lVar14 = (long)in_RSI - (ulong)(pLVar13->internal_donotuse).currentOffset;
        puVar15 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
        (pLVar13->internal_donotuse).dictSize = in_ECX + (pLVar13->internal_donotuse).dictSize;
        (pLVar13->internal_donotuse).currentOffset =
             in_ECX + (pLVar13->internal_donotuse).currentOffset;
        (pLVar13->internal_donotuse).tableType = 2;
        local_1c20 = in_RDX;
        local_1bf8 = in_RSI;
        if (0xc < (int)in_ECX) {
          rVar17 = LZ4_read_ARCH(in_RSI);
          uVar7 = LZ4_isLittleEndian();
          if (uVar7 == 0) {
            local_604 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_604 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
          }
          local_604 = local_604 >> 0x14;
          iVar5 = (int)lVar14;
          switch(0x1a201e) {
          case 0:
            break;
          case 1:
            pLVar13->table[local_604] = in_RSI;
            break;
          case 2:
            *(int *)((long)pLVar13 + (ulong)local_604 * 4) = iVar21 - iVar5;
            break;
          case 3:
            *(short *)((long)pLVar13 + (ulong)local_604 * 2) = sVar1 - (short)lVar14;
          }
          local_1bb0 = (undefined8 *)((long)in_RSI + 1);
          rVar17 = LZ4_read_ARCH(local_1bb0);
          uVar7 = LZ4_isLittleEndian();
          if (uVar7 == 0) {
            local_5dc = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_5dc = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
          }
          local_5dc = local_5dc >> 0x14;
          local_1c30 = local_5dc;
LAB_001a222e:
          local_1c68 = local_1bb0;
          local_1c6c = 1;
          local_1c70 = local_1fe4 << 6;
          puVar16 = local_1c68;
          do {
            do {
              local_1c68 = puVar16;
              uVar12 = local_1c30;
              uVar10 = (int)local_1c68 - iVar5;
              uVar7 = *(uint *)((long)pLVar13 + (ulong)local_1c30 * 4);
              puVar16 = (undefined8 *)((long)local_1c68 + (long)local_1c6c);
              iVar21 = local_1c70 + 1;
              local_1c6c = local_1c70 >> 6;
              if (puVar15 < puVar16) goto LAB_001a4ea7;
              local_1c38 = (undefined8 *)(lVar14 + (ulong)uVar7);
              rVar17 = LZ4_read_ARCH(puVar16);
              uVar11 = LZ4_isLittleEndian();
              if (uVar11 == 0) {
                local_5b4 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_5b4 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
              }
              local_5b4 = local_5b4 >> 0x14;
              local_1c30 = local_5b4;
              *(uint *)((long)pLVar13 + (ulong)uVar12 * 4) = uVar10;
              local_1c70 = iVar21;
            } while (uVar7 + 0xffff < uVar10);
            UVar9 = LZ4_read32(local_1c38);
            UVar8 = LZ4_read32(local_1c68);
          } while (UVar9 != UVar8);
          local_1bb0 = local_1c68;
          while( true ) {
            bVar25 = false;
            if (local_1bf8 < local_1bb0 && in_RSI < local_1c38) {
              bVar25 = *(char *)((long)local_1bb0 + -1) == *(char *)((long)local_1c38 + -1);
            }
            if (!bVar25) break;
            local_1bb0 = (undefined8 *)((long)local_1bb0 + -1);
            local_1c38 = (undefined8 *)((long)local_1c38 + -1);
          }
          uVar7 = (int)local_1bb0 - (int)local_1bf8;
          local_1c40 = local_1c20;
          if (uVar7 < 0xf) {
            *local_1c20 = (char)uVar7 * '\x10';
            local_1c20 = local_1c20 + 1;
          }
          else {
            *local_1c20 = -0x10;
            local_1c20 = local_1c20 + 1;
            for (local_1c84 = uVar7 - 0xf; 0xfe < local_1c84; local_1c84 = local_1c84 + -0xff) {
              *local_1c20 = -1;
              local_1c20 = local_1c20 + 1;
            }
            *local_1c20 = (char)local_1c84;
            local_1c20 = local_1c20 + 1;
          }
          local_cc0 = local_1c20;
          local_cc8 = local_1bf8;
          do {
            *(undefined8 *)local_cc0 = *local_cc8;
            local_cc0 = local_cc0 + 8;
            local_cc8 = local_cc8 + 1;
          } while (local_cc0 < local_1c20 + uVar7);
          local_1c20 = local_1c20 + uVar7;
          do {
            LZ4_writeLE16(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1e);
            local_1c20 = local_1c20 + 2;
            pcVar19 = (char *)((long)local_1bb0 + 4);
            local_a90 = (char *)((long)local_1c38 + 4);
            local_a88 = pcVar19;
            if (pcVar19 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
              rVar17 = LZ4_read_ARCH(local_a90);
              rVar18 = LZ4_read_ARCH(pcVar19);
              if (rVar17 == rVar18) {
                local_a90 = (char *)((long)local_1c38 + 0xc);
                local_a88 = (char *)((long)local_1bb0 + 0xc);
                goto LAB_001a3823;
              }
              local_a7c = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                     in_stack_ffffffffffffdc18));
            }
            else {
LAB_001a3823:
              for (; local_a88 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                  local_a88 = local_a88 + 8) {
                rVar17 = LZ4_read_ARCH(local_a90);
                rVar18 = LZ4_read_ARCH(local_a88);
                if (rVar17 != rVar18) {
                  uVar7 = LZ4_NbCommonBytes(CONCAT26(in_stack_ffffffffffffdc1e,
                                                     in_stack_ffffffffffffdc18));
                  local_a7c = ((int)local_a88 + uVar7) - (int)pcVar19;
                  goto LAB_001a3a38;
                }
                local_a90 = local_a90 + 8;
              }
              if (local_a88 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                UVar9 = LZ4_read32(local_a90);
                UVar8 = LZ4_read32(local_a88);
                if (UVar9 == UVar8) {
                  local_a88 = local_a88 + 4;
                  local_a90 = local_a90 + 4;
                }
              }
              if (local_a88 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                UVar3 = LZ4_read16(local_a90);
                UVar4 = LZ4_read16(local_a88);
                if (UVar3 == UVar4) {
                  local_a88 = local_a88 + 2;
                  local_a90 = local_a90 + 2;
                }
              }
              if ((local_a88 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                 (*local_a90 == *local_a88)) {
                local_a88 = local_a88 + 1;
              }
              local_a7c = (int)local_a88 - (int)pcVar19;
            }
LAB_001a3a38:
            local_1bf8 = (undefined8 *)((ulong)local_a7c + 4 + (long)local_1bb0);
            if (local_a7c < 0xf) {
              *local_1c40 = *local_1c40 + (char)local_a7c;
            }
            else {
              *local_1c40 = *local_1c40 + '\x0f';
              local_1c88 = local_a7c - 0xf;
              LZ4_write32(local_1c20,0xffffffff);
              for (; 0x3fb < local_1c88; local_1c88 = local_1c88 - 0x3fc) {
                local_1c20 = local_1c20 + 4;
                LZ4_write32(local_1c20,0xffffffff);
              }
              pcVar19 = local_1c20 + (ulong)local_1c88 / 0xff;
              local_1c20 = pcVar19 + 1;
              *pcVar19 = (char)((ulong)local_1c88 % 0xff);
            }
            if (puVar15 <= local_1bf8) break;
            pvVar24 = (void *)((long)local_1bf8 + -2);
            rVar17 = LZ4_read_ARCH(pvVar24);
            uVar7 = LZ4_isLittleEndian();
            if (uVar7 == 0) {
              local_58c = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_58c = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_58c = local_58c >> 0x14;
            switch(0x1a418e) {
            case 0:
              break;
            case 1:
              pLVar13->table[local_58c] = pvVar24;
              break;
            case 2:
              *(int *)((long)pLVar13 + (ulong)local_58c * 4) = (int)pvVar24 - iVar5;
              break;
            case 3:
              *(short *)((long)pLVar13 + (ulong)local_58c * 2) = (short)pvVar24 - (short)lVar14;
            }
            rVar17 = LZ4_read_ARCH(local_1bf8);
            uVar7 = LZ4_isLittleEndian();
            if (uVar7 == 0) {
              local_564 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_564 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_564 = local_564 >> 0x14;
            uVar12 = (int)local_1bf8 - iVar5;
            uVar7 = *(uint *)((long)pLVar13 + (ulong)local_564 * 4);
            local_1c38 = (undefined8 *)(lVar14 + (ulong)uVar7);
            *(uint *)((long)pLVar13 + (ulong)local_564 * 4) = uVar12;
            if (uVar7 + 0xffff < uVar12) goto LAB_001a4d0a;
            UVar9 = LZ4_read32(local_1c38);
            UVar8 = LZ4_read32(local_1bf8);
            if (UVar9 != UVar8) goto LAB_001a4d0a;
            local_1c40 = local_1c20;
            *local_1c20 = '\0';
            local_1c20 = local_1c20 + 1;
            local_1bb0 = local_1bf8;
          } while( true );
        }
LAB_001a4ea7:
        uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_1bf8);
        if (uVar20 < 0xf) {
          *local_1c20 = (char)uVar20 * '\x10';
          local_1c20 = local_1c20 + 1;
        }
        else {
          *local_1c20 = -0x10;
          pcVar19 = local_1c20;
          for (local_1cc0 = uVar20 - 0xf; local_1c20 = pcVar19 + 1, 0xfe < local_1cc0;
              local_1cc0 = local_1cc0 - 0xff) {
            *local_1c20 = -1;
            pcVar19 = local_1c20;
          }
          *local_1c20 = (char)local_1cc0;
          local_1c20 = pcVar19 + 2;
        }
        memcpy(local_1c20,local_1bf8,uVar20);
        local_1ee4 = ((int)uVar20 + (int)local_1c20) - local_1d38;
      }
    }
    else {
      local_1ee4 = 0;
    }
    local_1fbc = local_1ee4;
  }
  return local_1fbc;
LAB_001abf43:
  local_1800 = (undefined8 *)((long)local_1848 + 1);
  rVar17 = LZ4_read_ARCH(local_1800);
  uVar7 = LZ4_isLittleEndian();
  if (uVar7 == 0) {
    local_26c = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_26c = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
  }
  local_26c = local_26c >> 0x14;
  local_1880 = local_26c;
  goto LAB_001a94d6;
LAB_001a8663:
  local_19d8 = (undefined8 *)((long)local_1a20 + 1);
  UVar9 = LZ4_read32(local_19d8);
  goto LAB_001a5b85;
LAB_001a4d0a:
  local_1bb0 = (undefined8 *)((long)local_1bf8 + 1);
  rVar17 = LZ4_read_ARCH(local_1bb0);
  uVar7 = LZ4_isLittleEndian();
  if (uVar7 == 0) {
    local_53c = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_53c = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
  }
  local_53c = local_53c >> 0x14;
  local_1c30 = local_53c;
  goto LAB_001a222e;
LAB_001a13be:
  local_1d88 = (undefined8 *)((long)local_1dd0 + 1);
  UVar9 = LZ4_read32(local_1d88);
  goto LAB_0019e8e0;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}